

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

curl_slist * Curl_cookie_list(Curl_easy *data)

{
  char *data_00;
  curl_slist *pcVar1;
  long lVar2;
  Cookie *co;
  curl_slist *list;
  
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  if ((data->cookies == (CookieInfo *)0x0) || (data->cookies->numcookies == 0)) {
LAB_0011e1d8:
    list = (curl_slist *)0x0;
LAB_0011e1db:
    Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
    return list;
  }
  lVar2 = 0;
  list = (curl_slist *)0x0;
LAB_0011e16e:
  if (lVar2 != 0x3f) {
    co = (Cookie *)(data->cookies->cookies + lVar2);
    pcVar1 = list;
LAB_0011e186:
    do {
      list = pcVar1;
      co = co->next;
      if (co == (Cookie *)0x0) goto LAB_0011e1bc;
      pcVar1 = list;
      if (co->domain != (char *)0x0) {
        data_00 = get_netscape_format(co);
        if (data_00 != (char *)0x0) {
          pcVar1 = Curl_slist_append_nodup(list,data_00);
          if (pcVar1 != (curl_slist *)0x0) goto LAB_0011e186;
          (*Curl_cfree)(data_00);
        }
        curl_slist_free_all(list);
        goto LAB_0011e1d8;
      }
    } while( true );
  }
  goto LAB_0011e1db;
LAB_0011e1bc:
  lVar2 = lVar2 + 1;
  goto LAB_0011e16e;
}

Assistant:

struct curl_slist *Curl_cookie_list(struct Curl_easy *data)
{
  struct curl_slist *list;
  Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  list = cookie_list(data);
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
  return list;
}